

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSimpleHandleManager::GetObjectFromHandle
          (CSimpleHandleManager *this,CPalThread *pThread,HANDLE h,DWORD *pdwRightsGranted,
          IPalObject **ppObject)

{
  HANDLE_TABLE_ENTRY *pHVar1;
  IPalObject *pIVar2;
  bool bVar3;
  PAL_ERROR PVar4;
  
  InternalEnterCriticalSection(pThread,&this->m_csLock);
  bVar3 = ValidateHandle(this,h);
  if (bVar3) {
    pHVar1 = this->m_rghteHandleTable;
    *pdwRightsGranted = *(DWORD *)((long)pHVar1 + ((ulong)h & 0xfffffffffffffffc) * 4 + -8);
    pIVar2 = *(IPalObject **)((long)&pHVar1[-1].u + ((ulong)h & 0xfffffffffffffffc) * 4);
    *ppObject = pIVar2;
    (*pIVar2->_vptr_IPalObject[7])();
    PVar4 = 0;
  }
  else {
    PVar4 = 6;
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
  }
  InternalLeaveCriticalSection(pThread,&this->m_csLock);
  return PVar4;
}

Assistant:

PAL_ERROR
CSimpleHandleManager::GetObjectFromHandle(
    CPalThread *pThread,
    HANDLE h,
    DWORD *pdwRightsGranted,
    IPalObject **ppObject
    )
{
    PAL_ERROR palError = NO_ERROR;
    HANDLE_INDEX hi;

    Lock(pThread);
    
    if (!ValidateHandle(h))
    {
        ERROR("Tried to dereference an invalid handle %p\n", h);
        palError = ERROR_INVALID_HANDLE;
        goto GetObjectFromHandleExit;
    }
    
    hi = HandleToHandleIndex(h);

    *pdwRightsGranted = m_rghteHandleTable[hi].dwAccessRights;
    *ppObject = m_rghteHandleTable[hi].u.pObject;
    (*ppObject)->AddReference();
    
GetObjectFromHandleExit:

    Unlock(pThread);

    return palError;
}